

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O0

void __thiscall baryonyx::pnm_vector::flush(pnm_vector *this)

{
  pointer puVar1;
  pnm_vector *this_local;
  
  if (this->m_heigth != 0) {
    puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (&this->m_buffer);
    size(this);
    std::ostream::write((char *)&this->m_ofs,(long)puVar1);
    this->m_heigth = this->m_heigth + -1;
  }
  return;
}

Assistant:

void flush() noexcept
    {
        if (m_heigth == 0)
            return;

        m_ofs.write(reinterpret_cast<char*>(m_buffer.get()), size());
        --m_heigth;
    }